

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

bool google::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,size_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Xword EVar1;
  Elf64_Addr EVar2;
  Elf64_Off EVar3;
  Elf64_Xword EVar4;
  Elf64_Xword EVar5;
  Elf64_Xword EVar6;
  ulong uVar7;
  Elf64_Word EVar8;
  Elf64_Word EVar9;
  Elf64_Word EVar10;
  ulong uVar11;
  size_t count;
  ulong uVar12;
  undefined6 in_register_00000032;
  Elf64_Word *pEVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 local_448 [4];
  Elf64_Word local_444;
  Elf64_Shdr buf [16];
  
  if ((int)CONCAT62(in_register_00000032,sh_num) == 0) {
    bVar16 = false;
  }
  else {
    uVar15 = CONCAT62(in_register_00000032,sh_num) & 0xffffffff;
    uVar12 = 0;
    do {
      count = (uVar15 - uVar12) * 0x40;
      if (0x3ff < count) {
        count = 0x400;
      }
      uVar11 = ReadFromOffset(fd,local_448,count,uVar12 * 0x40 + sh_offset);
      bVar16 = uVar11 == 0xffffffffffffffff;
      if (bVar16) {
        type = 0;
LAB_00121cd3:
        bVar16 = true;
        goto LAB_00121cd9;
      }
      if (((uVar11 & 0x3f) != 0) || (0x43f < uVar11)) {
        abort();
      }
      pEVar13 = &local_444;
      uVar14 = uVar11 >> 6;
      uVar7 = uVar11;
      while (uVar7 != 0) {
        if (*pEVar13 == type) {
          EVar8 = pEVar13[0];
          EVar1 = *(Elf64_Xword *)(pEVar13 + 1);
          EVar2 = *(Elf64_Addr *)(pEVar13 + 3);
          EVar3 = *(Elf64_Off *)(pEVar13 + 5);
          EVar4 = *(Elf64_Xword *)(pEVar13 + 7);
          EVar9 = pEVar13[9];
          EVar10 = pEVar13[10];
          EVar5 = *(Elf64_Xword *)(pEVar13 + 0xb);
          EVar6 = *(Elf64_Xword *)(pEVar13 + 0xd);
          type = 1;
          out->sh_name = pEVar13[-1];
          out->sh_type = EVar8;
          out->sh_flags = EVar1;
          out->sh_addr = EVar2;
          out->sh_offset = EVar3;
          out->sh_size = EVar4;
          out->sh_link = EVar9;
          out->sh_info = EVar10;
          out->sh_addralign = EVar5;
          out->sh_entsize = EVar6;
          goto LAB_00121cd3;
        }
        pEVar13 = pEVar13 + 0x10;
        uVar14 = uVar14 - 1;
        uVar7 = uVar14;
      }
      uVar12 = uVar12 + (uVar11 >> 6);
    } while (uVar12 < uVar15);
    type = 0;
  }
LAB_00121cd9:
  return (bool)(bVar16 & (byte)type);
}

Assistant:

static ATTRIBUTE_NOINLINE bool
GetSectionHeaderByType(const int fd, ElfW(Half) sh_num, const size_t sh_offset,
                       ElfW(Word) type, ElfW(Shdr) *out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (size_t i = 0; i < sh_num;) {
    const size_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const size_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    if (len == -1) {
      return false;
    }
    SAFE_ASSERT(static_cast<size_t>(len) % sizeof(buf[0]) == 0);
    const size_t num_headers_in_buf = static_cast<size_t>(len) / sizeof(buf[0]);
    SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (size_t j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}